

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O1

int __thiscall
ExtraData::getArrayHeader(ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val)

{
  uint flag;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  int iVar7;
  TypedPropertyValue tmpVal;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_150;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  TypedPropertyValue local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"              ArrayHeader:          ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 Type:              ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_90,val);
  Utils::print_vec_from_to(&local_90,0,4);
  if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"MUST be set to the value obtained by clearing ",0x2e);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"the VT_ARRAY (0x2000) bit of this array property\'s PropertyType value.",0x46);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a8,val);
  flag = Utils::vectFourBytesToUnsignedInt(&local_a8,0);
  if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_f0.Type,&local_78);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_f0.Padding,&vStack_60);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_f0.Value,&local_48);
  parseTypedPropertyValueTypeAndValue(this,false,flag,&local_f0);
  if (local_f0.Value.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.Value.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.Value.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.Value.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.Padding.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.Padding.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.Padding.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.Padding.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.Type.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.Type.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.Type.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.Type.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_108,val);
  iVar1 = Utils::lenFourBytesFromPos(&local_108,4);
  if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                 NumDimensions:     ",0x24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_120,val);
  iVar2 = Utils::lenFourBytesFromPos(&local_120,4);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  if (local_120.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"n unsigned integer representing the number of dimensions ",0x39);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"in the array property. MUST be at least 1 and at most 31.",0x39);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (iVar1 < 1) {
    iVar2 = 8;
  }
  else {
    iVar2 = 8;
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"                 Dimension ",0x1b);
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":        ",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_138,val);
      iVar3 = Utils::lenFourBytesFromPos(&local_138,iVar2);
      if (local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_138.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"                   Size:            ",0x24);
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      poVar5 = (ostream *)std::ostream::flush();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"An unsigned integer representing the size of the dimension.",0x3b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_150,val);
      iVar4 = Utils::lenFourBytesFromPos(&local_150,iVar2 + 4);
      if (local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_150.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"                   IndexOffset:     ",0x24);
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      poVar5 = (ostream *)std::ostream::flush();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"A signed integer representing the index offset of the dimension.",0x40);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (iVar4 == 0) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                            Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,
                   "An array dimension that is to be accessed with a 0-based index would have the value zero."
                   ,0x59);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      else if (iVar4 == 1) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                            Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,
                   "An array dimension that is to be accessed with a 1-based index would have the value 0x00000001."
                   ,0x5f);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      iVar2 = iVar3 + iVar2;
      iVar7 = iVar7 + 1;
    } while (iVar1 != iVar7);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (vStack_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar2;
}

Assistant:

int ExtraData::getArrayHeader(std::vector<unsigned int> val) {
    cout << "              ArrayHeader:          " << endl;
    cout << "                 Type:              "; Utils::print_vec_from_to(val, 0, 4);
    cout << Utils::defaultOffsetDocInfo << "MUST be set to the value obtained by clearing " <<
            Utils::defaultOffsetDocInfo << "the VT_ARRAY (0x2000) bit of this array property's PropertyType value." << endl;
        unsigned int flag = Utils::vectFourBytesToUnsignedInt(val, 0);
        ExtraData::PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue tmpVal;
        ExtraData::parseTypedPropertyValueTypeAndValue(false, flag, tmpVal);
    int countOfDimen = Utils::lenFourBytesFromPos(val, 4);
    cout << "                 NumDimensions:     " << Utils::lenFourBytesFromPos(val, 4) << endl;
    cout << Utils::defaultOffsetDocInfo << "n unsigned integer representing the number of dimensions " <<
            Utils::defaultOffsetDocInfo << "in the array property. MUST be at least 1 and at most 31." << endl;
    int len = 8, size = 0, index = 0;
    for(int i = 0; i < countOfDimen; ++i) {
        cout << "                 Dimension " << dec << i << ":        " << endl;
        size = Utils::lenFourBytesFromPos(val, len);
        cout << "                   Size:            " << dec << size << endl <<
            Utils::defaultOffsetDocInfo << "An unsigned integer representing the size of the dimension." << endl;
        index = Utils::lenFourBytesFromPos(val, len + 4);
        cout << "                   IndexOffset:     " << hex << index << endl <<
             Utils::defaultOffsetDocInfo << "A signed integer representing the index offset of the dimension." << endl;
        if(index == 0x00000001)
            cout << Utils::defaultOffsetDocInfo << "An array dimension that is to be accessed with a 1-based index would have the value 0x00000001."
            << endl;
        if(index == 0)
            cout << Utils::defaultOffsetDocInfo << "An array dimension that is to be accessed with a 0-based index would have the value zero." << endl;
        len += size;
    }
    return len;
}